

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::UnionSchema::UnionSchema(UnionSchema *this)

{
  Schema *this_00;
  Node *in_RDI;
  
  this_00 = (Schema *)operator_new(0x30);
  NodeUnion::NodeUnion((NodeUnion *)this_00);
  Schema::Schema(this_00,in_RDI);
  in_RDI->_vptr_Node = (_func_int **)&PTR__UnionSchema_0030d238;
  return;
}

Assistant:

UnionSchema::UnionSchema() :
    Schema(new NodeUnion)
{ }